

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O3

void __thiscall
ParamMeasure::walkforward(ParamMeasure *this,WalkState *state,PcodeOp *ignoreop,Varnode *vn)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  pointer ppVVar3;
  bool bVar4;
  ParamRank PVar5;
  ParamRank PVar6;
  uint uVar7;
  ParamRank PVar8;
  int iVar9;
  _List_node_base *p_Var10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  iVar9 = state->depth;
  state->depth = iVar9 + 1;
  if (iVar9 < 9) {
    p_Var10 = (vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    PVar5 = this->rank;
    PVar6 = state->terminalrank;
    if (p_Var10 != (_List_node_base *)&vn->descend && PVar5 != PVar6) {
      do {
        pPVar2 = (PcodeOp *)p_Var10[1]._M_next;
        if (pPVar2 == ignoreop) goto LAB_0030ca81;
        OVar1 = pPVar2->opcode->opcode;
        switch(OVar1) {
        case CPUI_BRANCH:
        case CPUI_BRANCHIND:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if (0 < (int)uVar7) {
            uVar11 = 0;
            do {
              if (ppVVar3[uVar11] == vn) {
                if (uVar11 == 0) goto switchD_0030c8b2_caseD_9;
                break;
              }
              uVar11 = uVar11 + 1;
            } while ((uVar7 & 0x7fffffff) != uVar11);
            goto LAB_0030ca81;
          }
          break;
        case CPUI_CBRANCH:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if (0 < (int)uVar7) {
            uVar11 = 0;
            do {
              if (ppVVar3[uVar11] == vn) {
                uVar7 = (uint)uVar11;
                break;
              }
              uVar11 = uVar11 + 1;
            } while ((uVar7 & 0x7fffffff) != uVar11);
            if (1 < (int)uVar7) goto LAB_0030ca81;
          }
          break;
        case CPUI_CALL:
        case CPUI_CALLIND:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if (0 < (int)uVar7) {
            uVar11 = 0;
            do {
              if (ppVVar3[uVar11] == vn) {
                if (uVar11 == 0) goto switchD_0030c8b2_caseD_9;
                break;
              }
              uVar11 = uVar11 + 1;
            } while ((uVar7 & 0x7fffffff) != uVar11);
            this->numcalls = this->numcalls + 1;
            bVar4 = (int)PVar5 < 4;
            if (state->best != false) {
              bVar4 = 4 < (int)PVar5;
            }
            PVar8 = SUBFNPARAM;
            goto LAB_0030ca0c;
          }
          break;
        case CPUI_CALLOTHER:
          break;
        case CPUI_RETURN:
          bVar4 = (int)PVar5 < 5;
          if (state->best != false) {
            bVar4 = 5 < (int)PVar5;
          }
          PVar8 = SUBFNRETURN;
LAB_0030ca0c:
          if (bVar4) {
            PVar5 = PVar8;
          }
          goto LAB_0030ca7c;
        default:
          if (OVar1 == CPUI_MULTIEQUAL) {
            ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar11 = (ulong)((long)(pPVar2->inrefs).
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppVVar3) >> 3;
            uVar7 = (uint)uVar11;
            if ((int)uVar7 < 1) {
              lVar12 = 0;
            }
            else {
              uVar13 = 0;
              do {
                uVar14 = uVar13;
                if (ppVVar3[uVar13] == vn) break;
                uVar13 = uVar13 + 1;
                uVar14 = uVar11;
              } while ((uVar7 & 0x7fffffff) != uVar13);
              lVar12 = (long)(int)uVar14;
            }
            if (((pPVar2->parent->super_FlowBlock).intothis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12].label & 2) == 0) {
              walkforward(this,state,(PcodeOp *)0x0,pPVar2->output);
              PVar5 = this->rank;
              PVar6 = state->terminalrank;
            }
            goto LAB_0030ca81;
          }
          if (OVar1 != CPUI_INDIRECT) break;
          bVar4 = (int)PVar5 < 6;
          if (state->best != false) {
            bVar4 = 6 < (int)PVar5;
          }
          if (bVar4) {
            PVar5 = INDIRECT;
          }
          goto LAB_0030ca7c;
        }
switchD_0030c8b2_caseD_9:
        bVar4 = (int)PVar5 < 2;
        if (state->best != false) {
          bVar4 = 2 < (int)PVar5;
        }
        if (bVar4) {
          PVar5 = DIRECTREAD;
        }
LAB_0030ca7c:
        this->rank = PVar5;
LAB_0030ca81:
      } while ((PVar5 != PVar6) &&
              (p_Var10 = p_Var10->_M_next, p_Var10 != (_List_node_base *)&vn->descend));
      iVar9 = state->depth + -1;
    }
  }
  state->depth = iVar9;
  return;
}

Assistant:

void ParamMeasure::walkforward( WalkState &state, PcodeOp *ignoreop, Varnode *vn )

{
  state.depth += 1;
  if (state.depth >= MAXDEPTH) {
    state.depth -= 1;
    return;
  }
  list<PcodeOp *>::const_iterator iter = vn->beginDescend();
  while( rank != state.terminalrank && iter != vn->endDescend() ) {
    PcodeOp *op = *iter;
    if( op != ignoreop ) {
      OpCode oc = op->getOpcode()->getOpcode();
      switch( oc ) {
      case CPUI_BRANCH:
      case CPUI_BRANCHIND:
	if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
	break;
      case CPUI_CBRANCH:
        if( op->getSlot(vn) < 2 ) updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_CALL:
      case CPUI_CALLIND:
        if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
        else {
          numcalls++;
          updaterank( SUBFNPARAM, state.best );
        }
        break;
      case CPUI_CALLOTHER:
        updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_RETURN:
        updaterank( THISFNRETURN, state.best );
        break;
      case CPUI_INDIRECT:
        updaterank( INDIRECT, state.best );
        break;
      case CPUI_MULTIEQUAL:
        // The only op for which there can be a loop in the graph is with the MULTIEQUAL (not for CALL, etc.).
        // Walk forward only if the path is not part of a loop.
        if( !op->getParent()->isLoopIn(op->getSlot(vn)) ) walkforward( state, (PcodeOp *)0, op->getOut() );
        break;
      default:
        updaterank( DIRECTREAD, state.best );
        break;
      }
    }
    iter++;
  }
  state.depth -= 1;
}